

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O0

void nn_bipc_destroy(nn_epbase *self)

{
  nn_fsm *local_20;
  nn_bipc *bipc;
  nn_epbase *self_local;
  
  if (self == (nn_epbase *)0x0) {
    local_20 = (nn_fsm *)0x0;
  }
  else {
    local_20 = (nn_fsm *)(self + -6);
  }
  if (*(int *)&local_20[1].fn != 1) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)&local_20[1].fn,
            "NN_BIPC_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x9d);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_term((nn_list *)&local_20[8].ctx);
  if (local_20[8].owner != (nn_fsm *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bipc->aipc == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x9f);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_usock_term((nn_usock *)&local_20[1].srcptr);
  nn_backoff_term((nn_backoff *)&local_20[8].stopped.src);
  nn_epbase_term((nn_epbase *)&local_20[1].shutdown_fn);
  nn_fsm_term(local_20);
  nn_free(local_20);
  return;
}

Assistant:

static void nn_bipc_destroy (struct nn_epbase *self)
{
    struct nn_bipc *bipc;

    bipc = nn_cont (self, struct nn_bipc, epbase);

    nn_assert_state (bipc, NN_BIPC_STATE_IDLE);
    nn_list_term (&bipc->aipcs);
    nn_assert (bipc->aipc == NULL);
    nn_usock_term (&bipc->usock);
    nn_backoff_term (&bipc->retry);
    nn_epbase_term (&bipc->epbase);
    nn_fsm_term (&bipc->fsm);

    nn_free (bipc);
}